

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O0

REF_STATUS ref_import_fgrid(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  uint uVar1;
  int iVar2;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT new_cell;
  REF_INT cell;
  REF_INT face_id;
  REF_INT nodes [4];
  int local_70;
  int local_6c;
  REF_INT new_tri;
  REF_INT tri;
  REF_DBL xyz;
  REF_INT new_node;
  REF_INT node;
  REF_INT ixyz;
  REF_INT ntet;
  REF_INT ntri;
  REF_INT nnode;
  FILE *file;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  char *filename_local;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  ref_grid = (REF_GRID)filename;
  filename_local = (char *)ref_mpi;
  ref_mpi_local = (REF_MPI)ref_grid_ptr;
  uVar1 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar1 == 0) {
    ref_node = *(REF_NODE *)ref_mpi_local;
    ref_cell = *(REF_CELL *)&ref_node->blank;
    _ntri = fopen((char *)ref_grid,"r");
    if (_ntri == (FILE *)0x0) {
      printf("unable to open %s\n",ref_grid);
    }
    if (_ntri == (FILE *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0xab
             ,"ref_import_fgrid","unable to open file");
      ref_grid_ptr_local._4_4_ = 2;
    }
    else {
      iVar2 = __isoc99_fscanf(_ntri,"%d",&ntet);
      if (iVar2 == 1) {
        iVar2 = __isoc99_fscanf(_ntri,"%d",&ixyz);
        if (iVar2 == 1) {
          iVar2 = __isoc99_fscanf(_ntri,"%d",&node);
          if (iVar2 == 1) {
            for (xyz._4_4_ = 0; xyz._4_4_ < ntet; xyz._4_4_ = xyz._4_4_ + 1) {
              uVar1 = ref_node_add((REF_NODE)ref_cell,(long)xyz._4_4_,(REF_INT *)&xyz);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0xb2,"ref_import_fgrid",(ulong)uVar1,"new_node");
                return uVar1;
              }
              if (xyz._4_4_ != xyz._0_4_) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0xb3,"ref_import_fgrid","node index");
                return 1;
              }
            }
            uVar1 = ref_node_initialize_n_global((REF_NODE)ref_cell,(long)ntet);
            if (uVar1 == 0) {
              for (new_node = 0; new_node < 3; new_node = new_node + 1) {
                for (xyz._4_4_ = 0; xyz._4_4_ < ntet; xyz._4_4_ = xyz._4_4_ + 1) {
                  iVar2 = __isoc99_fscanf(_ntri,"%lf",&new_tri);
                  if (iVar2 != 1) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0xba,"ref_import_fgrid","xyz");
                    return 1;
                  }
                  *(undefined8 *)(ref_cell->c2n + (long)(new_node + xyz._4_4_ * 0xf) * 2) = _new_tri
                  ;
                }
              }
              file = (FILE *)ref_node->part;
              nodes[1] = -1;
              for (local_6c = 0; local_6c < ixyz; local_6c = local_6c + 1) {
                for (xyz._4_4_ = 0; xyz._4_4_ < 3; xyz._4_4_ = xyz._4_4_ + 1) {
                  iVar2 = __isoc99_fscanf(_ntri,"%d",&cell + xyz._4_4_);
                  if (iVar2 != 1) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0xc2,"ref_import_fgrid","tri");
                    return 1;
                  }
                }
                cell = cell + -1;
                face_id = face_id + -1;
                nodes[0] = nodes[0] + -1;
                uVar1 = ref_cell_add((REF_CELL)file,&cell,&local_70);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0xc6,"ref_import_fgrid",(ulong)uVar1,"new tri");
                  return uVar1;
                }
                if (local_6c != local_70) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,199,"ref_import_fgrid","tri index");
                  return 1;
                }
              }
              file = (FILE *)ref_node->part;
              for (local_6c = 0; local_6c < ixyz; local_6c = local_6c + 1) {
                iVar2 = __isoc99_fscanf(_ntri,"%d",&new_cell);
                if (iVar2 != 1) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0xcc,"ref_import_fgrid","tri id");
                  return 1;
                }
                *(REF_INT *)
                 (file->_IO_buf_base + (long)(*(int *)&file->_IO_read_ptr * local_6c + 3) * 4) =
                     new_cell;
              }
              file = (FILE *)ref_node->ref_mpi;
              for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < node;
                  ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                for (xyz._4_4_ = 0; xyz._4_4_ < 4; xyz._4_4_ = xyz._4_4_ + 1) {
                  iVar2 = __isoc99_fscanf(_ntri,"%d",&cell + xyz._4_4_);
                  if (iVar2 != 1) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0xd3,"ref_import_fgrid","tet");
                    return 1;
                  }
                }
                cell = cell + -1;
                face_id = face_id + -1;
                nodes[0] = nodes[0] + -1;
                nodes[1] = nodes[1] + -1;
                uVar1 = ref_cell_add((REF_CELL)file,&cell,&ref_private_macro_code_rss_1);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0xd8,"ref_import_fgrid",(ulong)uVar1,"new tet");
                  return uVar1;
                }
                if (ref_private_macro_code_rss != ref_private_macro_code_rss_1) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0xd9,"ref_import_fgrid","tet index");
                  return 1;
                }
              }
              fclose(_ntri);
              ref_grid_ptr_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0xb6,"ref_import_fgrid",(ulong)uVar1,"init glob");
              ref_grid_ptr_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0xaf,"ref_import_fgrid","ntet");
            ref_grid_ptr_local._4_4_ = 1;
          }
        }
        else {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0xae,"ref_import_fgrid","ntri");
          ref_grid_ptr_local._4_4_ = 1;
        }
      }
      else {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0xad,"ref_import_fgrid","nnode");
        ref_grid_ptr_local._4_4_ = 1;
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0xa5,
           "ref_import_fgrid",(ulong)uVar1,"create grid");
    ref_grid_ptr_local._4_4_ = uVar1;
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_import_fgrid(REF_GRID *ref_grid_ptr,
                                           REF_MPI ref_mpi,
                                           const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  FILE *file;
  REF_INT nnode, ntri, ntet;
  REF_INT ixyz, node, new_node;
  REF_DBL xyz;
  REF_INT tri, new_tri;
  REF_INT nodes[4];
  REF_INT face_id;
  REF_INT cell, new_cell;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RES(1, fscanf(file, "%d", &nnode), "nnode");
  RES(1, fscanf(file, "%d", &ntri), "ntri");
  RES(1, fscanf(file, "%d", &ntet), "ntet");

  for (node = 0; node < nnode; node++) {
    RSS(ref_node_add(ref_node, node, &new_node), "new_node");
    RES(node, new_node, "node index");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");

  for (ixyz = 0; ixyz < 3; ixyz++)
    for (node = 0; node < nnode; node++) {
      RES(1, fscanf(file, "%lf", &xyz), "xyz");
      ref_node_xyz(ref_node, ixyz, node) = xyz;
    }

  ref_cell = ref_grid_tri(ref_grid);
  nodes[3] = REF_EMPTY;
  for (tri = 0; tri < ntri; tri++) {
    for (node = 0; node < 3; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tri");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_tri), "new tri");
    RES(tri, new_tri, "tri index");
  }

  ref_cell = ref_grid_tri(ref_grid);
  for (tri = 0; tri < ntri; tri++) {
    RES(1, fscanf(file, "%d", &face_id), "tri id");
    ref_cell_c2n(ref_cell, 3, tri) = face_id;
  }

  ref_cell = ref_grid_tet(ref_grid);
  for (cell = 0; cell < ntet; cell++) {
    for (node = 0; node < 4; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tet");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    nodes[3]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new tet");
    RES(cell, new_cell, "tet index");
  }

  fclose(file);

  return REF_SUCCESS;
}